

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O3

double __thiscall TasGrid::RuleWavelet::eval_linear<0>(RuleWavelet *this,int point,double x)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  
  uVar2 = point - 1;
  iVar3 = 0;
  if (1 < uVar2) {
    iVar3 = 0;
    uVar4 = uVar2;
    do {
      uVar4 = (int)uVar4 >> 1;
      iVar3 = iVar3 + 1;
    } while (1 < uVar4);
  }
  iVar6 = 1 << ((byte)iVar3 & 0x1f);
  iVar5 = (int)uVar2 % iVar6;
  dVar7 = ldexp(1.0,iVar3 + -2);
  if (iVar5 == 0) {
    dVar7 = dVar7 * (x + 1.0) + -1.0;
    if (0.5 < ABS(dVar7 + 0.5)) {
      return 0.0;
    }
    if (dVar7 < -0.75) goto LAB_001c4bfb;
    bVar1 = -0.5 < dVar7;
    if (x <= 0.0) {
      bVar1 = -0.5 <= dVar7;
    }
    if (!bVar1) goto LAB_001c4cc0;
    bVar1 = 0.0 < dVar7;
    if (x <= 0.0) {
      bVar1 = 0.0 <= dVar7;
    }
  }
  else {
    if (iVar5 != iVar6 + -1) {
      dVar7 = dVar7 * (x + 1.0) + -1.0 + (double)(iVar5 + -1) * -0.5;
      if (0.75 < ABS(dVar7 + 0.25)) {
        return 0.0;
      }
      if (-0.5 <= dVar7) {
        if (dVar7 < -0.25) {
          return dVar7 * 4.0 + 1.75;
        }
        if (0.0 <= dVar7) {
          if (0.5 <= dVar7) {
            return 0.0;
          }
          dVar7 = dVar7 * 0.5;
        }
        else {
          dVar7 = dVar7 * -4.0;
        }
        return dVar7 + -0.25;
      }
      return dVar7 * -0.5 + -0.5;
    }
    dVar7 = dVar7 * (1.0 - x) + -1.0;
    if (0.5 < ABS(dVar7 + 0.5)) {
      return 0.0;
    }
    if (dVar7 < -0.75) {
LAB_001c4bfb:
      return (dVar7 * 7.0 + 6.0) * 0.75;
    }
    bVar1 = -0.5 < dVar7;
    if (0.0 < x) {
      bVar1 = -0.5 <= dVar7;
    }
    if (!bVar1) {
LAB_001c4cc0:
      return (dVar7 * 11.0 + 6.0) * -0.25;
    }
    bVar1 = 0.0 < dVar7;
    if (0.0 < x) {
      bVar1 = 0.0 <= dVar7;
    }
  }
  dVar8 = 0.0;
  if (!bVar1) {
    dVar8 = dVar7 * 0.25;
  }
  return dVar8;
}

Assistant:

inline double RuleWavelet::eval_linear(int point, double x) const{
    // Given a wavelet designated by point and a value x, evaluates the wavelet (or its derivative) at x.
    // If x <= 0 (resp. x > 0), we take only right (resp. left) derivatives.

    // Standard Lifted Wavelets
    int l = Maths::intlog2(point - 1);
    int subindex = (point - 1) % (1 << l);
    double scale = std::pow(2,l-2);

    double value;
    if (subindex == 0){
        // Left boundary wavelet.
        value = linear_boundary_wavelet<mode>(scale * (x + 1.) - 1., x <= 0.0);
    } else if (subindex == (1 << l) - 1) {
        // Right boundary wavelet.
        value = linear_boundary_wavelet<mode>(scale * (1. - x) - 1., x > 0.0);
    } else {
        // Central wavelets
        double shift = 0.5 * (double (subindex - 1));
        value = linear_central_wavelet<mode>(scale * (x + 1) - 1. - shift, x <= 0.0);
    }
    // Adjust for the chain rule multiplier.
    if (mode == 1) value *= (subindex == (1 << l) - 1) ? -scale : scale;

    return value;
}